

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleString_StrCmp_Test::TEST_SimpleString_StrCmp_Test(TEST_SimpleString_StrCmp_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator.free_name_ = (char *)0x0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
    super_TestMemoryAllocator.hasBeenDestroyed_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator.name_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator.alloc_name_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator._vptr_TestMemoryAllocator = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).stash.originalAllocator_ =
       (TestMemoryAllocator *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleString_00364e78;
  TestMemoryAllocator::TestMemoryAllocator
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator
              .super_TestMemoryAllocator,"generic","alloc","free");
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__MemoryLeakAllocator_00364eb8;
  GlobalSimpleStringAllocatorStash::GlobalSimpleStringAllocatorStash
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleString).stash);
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleString_003635a8;
  return;
}

Assistant:

TEST(SimpleString, StrCmp)
{
    char empty[] = "";
    char blabla[] = "blabla";
    char bla[] = "bla";
    CHECK(SimpleString::StrCmp(empty, empty) == 0);
    CHECK(SimpleString::StrCmp(bla, blabla) == -(int)'b');
    CHECK(SimpleString::StrCmp(blabla, bla) == 'b');
    CHECK(SimpleString::StrCmp(bla, empty) == 'b');
    CHECK(SimpleString::StrCmp(empty, bla) == -(int)'b');
    CHECK(SimpleString::StrCmp(bla, bla) == 0);
}